

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

stumpless_target * stumpless_open_socket_target(char *name,char *param_2)

{
  stumpless_target *target;
  size_t dest_len;
  size_t source_len;
  socket_target *psVar1;
  char *source;
  char temp_name [18];
  
  source = temp_name;
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else {
    target = new_target(STUMPLESS_SOCKET_TARGET,name);
    if (target != (stumpless_target *)0x0) {
      dest_len = strlen(name);
      if (param_2 == (char *)0x0) {
        source_len = abstract_socket_names_get_local_socket_name(temp_name);
      }
      else {
        source_len = strlen(param_2);
        source = param_2;
      }
      psVar1 = new_socket_target(name,dest_len,source,source_len);
      target->id = psVar1;
      if (psVar1 != (socket_target *)0x0) {
        stumpless_set_current_target(target);
        return target;
      }
      destroy_target(target);
    }
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_socket_target( const char *name,
                              const char *local_socket ) {
  struct stumpless_target *target;
  size_t name_len;
  size_t local_socket_len;
  char temp_name[18];
  size_t temp_name_len;

  VALIDATE_ARG_NOT_NULL( name );

  target = new_target( STUMPLESS_SOCKET_TARGET, name );

  if( !target ) {
    goto fail;
  }

  name_len = strlen( name );

  if( !local_socket ) {
    temp_name_len = config_get_local_socket_name( temp_name );
    target->id = new_socket_target( name, name_len, temp_name, temp_name_len );
  } else {
    local_socket_len = strlen( local_socket );
    target->id =
      new_socket_target( name, name_len, local_socket, local_socket_len );
  }

  if( !target->id ) {
    goto fail_id;
  }

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}